

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleSum.cpp
# Opt level: O2

void __thiscall
OpenMD::MultipoleSum::MultipoleSum
          (MultipoleSum *this,SimInfo *info,string *filename,string *sele1,RealType rmax,int nrbins)

{
  SelectionEvaluator *this_00;
  pointer pdVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<double,_std::allocator<double>_> *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  string *local_58;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nrbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__MultipoleSum_002ede28;
  this->nRBins_ = (long)nrbins;
  this->rMax_ = rmax;
  local_60 = &this->aveDlength_;
  local_68 = &this->aveQlength_;
  local_70 = &this->aveDcount_;
  local_78 = &this->aveQcount_;
  (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->selectionScript1_,(string *)sele1);
  local_58 = &this->selectionScript1_;
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  getPrefix(&local_50,filename);
  std::operator+(&local_98,&local_50,".multipoleSum");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_50);
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_98,this_00);
    SelectionManager::setSelectionSet(&this->seleMan1_,(SelectionSet *)&local_98);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_98);
  }
  pdVar1 = (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->aveDlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  local_98._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_60,this->nRBins_,(value_type_conflict2 *)&local_98);
  pdVar1 = (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->aveQlength_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  local_98._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_68,this->nRBins_,(value_type_conflict2 *)&local_98);
  pdVar1 = (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->aveDcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  local_98._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_70,this->nRBins_,(value_type_conflict2 *)&local_98);
  pdVar1 = (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->aveQcount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  local_98._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_78,this->nRBins_,(value_type_conflict2 *)&local_98);
  pdVar1 = (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->aveDproj_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  local_98._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->aveDproj_,this->nRBins_,(value_type_conflict2 *)&local_98);
  this->deltaR_ =
       this->rMax_ /
       (((double)CONCAT44(0x45300000,(int)(this->nRBins_ >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)this->nRBins_) - 4503599627370496.0));
  return;
}

Assistant:

MultipoleSum::MultipoleSum(SimInfo* info, const std::string& filename,
                             const std::string& sele1, RealType rmax,
                             int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      nRBins_(nrbins), rMax_(rmax), selectionScript1_(sele1), seleMan1_(info),
      evaluator1_(info) {
    setOutputName(getPrefix(filename) + ".multipoleSum");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    aveDlength_.clear();
    aveDlength_.resize(nRBins_, 0.0);
    aveQlength_.clear();
    aveQlength_.resize(nRBins_, 0.0);
    aveDcount_.clear();
    aveDcount_.resize(nRBins_, 0.0);
    aveQcount_.clear();
    aveQcount_.resize(nRBins_, 0.0);
    aveDproj_.clear();
    aveDproj_.resize(nRBins_, 0.0);
    deltaR_ = rMax_ / nRBins_;
  }